

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O3

void read_wake_fd(void *fd_as_ptr,void *junk)

{
  ssize_t sVar1;
  char buffer;
  undefined1 local_1;
  
  sVar1 = read((int)fd_as_ptr,&local_1,1);
  if (sVar1 == 1) {
    return;
  }
  perror("wake read failed\n");
  return;
}

Assistant:

static void read_wake_fd(void *fd_as_ptr, void *junk)
{
    char buffer;
    SOCKET fd = (SOCKET) (intptr_t)fd_as_ptr;
#ifdef HAVE_WINDOWS_H
    recv(fd, &buffer, 1, 0);
#else
    if (read(fd, &buffer, 1) != 1) {
	perror("wake read failed\n");
    }
#endif
}